

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  int iVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  N_Vector c;
  WebData wdata;
  sunrealtype **ppsVar12;
  N_Vector p_Var13;
  void *pvVar14;
  sunrealtype (*pasVar15) [6];
  WebData paVar16;
  long lVar17;
  char *pcVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  bool bVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  int iVar35;
  undefined1 auVar34 [16];
  int iVar36;
  SUNContext ctx;
  void *arkode_mem;
  long nst_1;
  long nni;
  long nfi;
  long nfe;
  long nst;
  sunrealtype t;
  long nfeLS;
  long nli;
  long nni_1;
  long nfe_1;
  long ncfl;
  long nps;
  long npe;
  long netf;
  long ncfn;
  long nsetups;
  long nfi_1;
  undefined8 local_110;
  long local_108;
  long local_100;
  void *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  int local_c8;
  int local_c4;
  sunrealtype local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  WebData local_98;
  char *local_90;
  sunrealtype local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_f8 = (void *)0x0;
  iVar9 = 0;
  uVar8 = SUNContext_Create(0,&local_110);
  if ((int)uVar8 < 0) {
    pcVar18 = "SUNContext_Create";
LAB_001035cc:
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar18,(ulong)uVar8);
  }
  else {
    if (1 < argc) {
      iVar9 = atoi(argv[1]);
    }
    c = (N_Vector)N_VNew_Serial(0xd8,local_110);
    uVar7 = local_110;
    if (c != (N_Vector)0x0) {
      wdata = (WebData)malloc(0x990);
      lVar23 = 4;
      do {
        ppsVar12 = (sunrealtype **)SUNDlsMat_newDenseMat(6,6);
        wdata->P[lVar23 + -4] = ppsVar12;
        ppsVar12 = (sunrealtype **)SUNDlsMat_newIndexArray(6);
        wdata->P[lVar23] = ppsVar12;
        lVar23 = lVar23 + 1;
      } while (lVar23 != 8);
      p_Var13 = (N_Vector)N_VNew_Serial(0xd8,uVar7);
      wdata->rewt = p_Var13;
      p_Var13 = (N_Vector)N_VNew_Serial(0xd8,uVar7);
      wdata->tmp = p_Var13;
      wdata->ns = 6;
      lVar23 = 0;
      paVar16 = wdata;
      do {
        lVar17 = 0xc0;
        do {
          *(undefined8 *)((long)paVar16->P + lVar17) = 0;
          lVar17 = lVar17 + 0x30;
        } while (lVar17 != 0x1e0);
        lVar23 = lVar23 + 1;
        paVar16 = (WebData)(paVar16->P + 1);
      } while (lVar23 != 6);
      pasVar15 = wdata->acoef + 3;
      lVar23 = 0;
      do {
        lVar17 = -0x90;
        do {
          *(undefined8 *)((long)(pasVar15 + 3) + lVar17) = 0x40c3880000000000;
          *(undefined8 *)((long)*pasVar15 + lVar17 + 0x18) = 0xbea0c6f7a0b5ed8d;
          lVar17 = lVar17 + 0x30;
        } while (lVar17 != 0);
        *(undefined8 *)((long)wdata->acoef + lVar23 * 0x38) = 0xbff0000000000000;
        wdata->bcoef[lVar23 * 7 + -0xf] = -1.0;
        wdata->bcoef[lVar23] = 1.0;
        wdata->bcoef[lVar23 + 3] = -1.0;
        wdata->diff[lVar23] = 1.0;
        wdata->diff[lVar23 + 3] = 0.5;
        lVar23 = lVar23 + 1;
        pasVar15 = (sunrealtype (*) [6])(*pasVar15 + 1);
      } while (lVar23 != 3);
      wdata->mxns = 0x24;
      wdata->dx = 0.2;
      wdata->dy = 0.2;
      auVar5 = _DAT_00105020;
      lVar23 = 0x42;
      do {
        auVar29 = divpd(*(undefined1 (*) [16])(wdata->P + lVar23),auVar5);
        *(undefined1 (*) [16])(wdata->pivot + lVar23 + 2) = auVar29;
        *(undefined1 (*) [16])(wdata->pivot + lVar23 + 8) = auVar29;
        lVar23 = lVar23 + 2;
      } while (lVar23 != 0x48);
      wdata->mp = 6;
      wdata->mq = 0x24;
      wdata->mx = 6;
      wdata->my = 6;
      wdata->srur = 1.4901161193847656e-08;
      wdata->ngrp = 4;
      wdata->ngx = 2;
      wdata->ngy = 2;
      wdata->mxmp = 0x24;
      pvVar14 = (void *)0x0;
      wdata->jigx[2] = 0;
      wdata->jigx[0] = 0;
      wdata->jigx[1] = 0;
      wdata->jigx[3] = 1;
      wdata->jigx[4] = 1;
      wdata->jigx[5] = 1;
      wdata->jxr[1] = 4;
      wdata->jgx[0] = 0;
      wdata->jgx[1] = 3;
      *(undefined8 *)(wdata->jgx + 2) = 6;
      wdata->jgy[1] = 3;
      wdata->jgy[2] = 6;
      wdata->jigy[2] = 0;
      wdata->jigy[0] = 0;
      wdata->jigy[1] = 0;
      wdata->jigy[3] = 1;
      wdata->jigy[4] = 1;
      *(undefined8 *)(wdata->jigy + 5) = 0x100000001;
      wdata->jyr[0] = 1;
      wdata->jyr[1] = 4;
      puts("\n\nDemonstration program for ARKODE - SPGMR linear solver\n");
      printf("Food web problem with ns species, ns = %d\n",6);
      puts("Predator-prey interaction and diffusion on a 2-D square\n");
      printf("Matrix parameters: a = %.2g   e = %.2g   g = %.2g\n",0,0x40c3880000000000,
             0x3ea0c6f7a0b5ed8d);
      printf("b parameter = %.2g\n",0);
      printf("Diffusion coefficients: Dprey = %.2g   Dpred = %.2g\n",0,0x3fe0000000000000);
      printf("Rate parameter alpha = %.2g\n\n",0);
      printf("Mesh dimensions (mx,my) are %d, %d.  ",6,6);
      printf("Total system size is neq = %d \n\n",0xd8);
      printf("Tolerances: reltol = %.2g, abstol = %.2g \n\n",0x88e368f1,0x3ee4f8b588e368f1);
      puts("Preconditioning uses a product of:");
      printf("  (1) Gauss-Seidel iterations with ");
      printf("itmax = %d iterations, and\n",5);
      printf("  (2) interaction-only block-diagonal matrix ");
      puts("with block-grouping");
      printf("  Number of diagonal block groups = ngrp = %d",4);
      printf("  (ngx by ngy, ngx = %d, ngy = %d)\n",2,2);
      printf("\n\n--------------------------------------------------------------");
      puts("--------------");
      if (iVar9 == 2) {
        uVar8 = 0xbff00000;
      }
      else {
        uVar8 = 0;
      }
      local_108 = (ulong)uVar8 << 0x20;
      if (iVar9 == 1) {
        local_108 = 0x402d64d51e0db1c6;
      }
      iVar9 = 1;
      local_100 = 0;
      local_98 = wdata;
      do {
        local_90 = "SUN_PREC_RIGHT";
        if (iVar9 == 1) {
          local_90 = "SUN_PREC_LEFT";
        }
        iVar22 = 1;
        local_c8 = iVar9;
        do {
          lVar23 = N_VGetArrayPointer(c);
          auVar29 = _DAT_00105080;
          auVar5 = _DAT_00105070;
          iVar3 = wdata->ns;
          iVar4 = wdata->mxns;
          dVar1 = wdata->dx;
          dVar2 = wdata->dy;
          lVar17 = (ulong)(iVar3 + 1U) - 2;
          auVar30._8_4_ = (int)lVar17;
          auVar30._0_8_ = lVar17;
          auVar30._12_4_ = (int)((ulong)lVar17 >> 0x20);
          lVar23 = lVar23 + 8;
          lVar17 = 0;
          do {
            dVar31 = (double)(int)lVar17 * dVar2;
            dVar31 = dVar31 * 4.0 * (1.0 - dVar31);
            dVar31 = dVar31 * dVar31;
            lVar20 = 0;
            lVar19 = lVar23;
            do {
              dVar32 = (double)(int)lVar20 * dVar1;
              if (0 < iVar3) {
                dVar32 = dVar32 * 4.0 * (1.0 - dVar32);
                dVar32 = dVar32 * dVar32;
                uVar21 = 0;
                do {
                  iVar6 = (int)uVar21;
                  auVar33._8_4_ = iVar6;
                  auVar33._0_8_ = uVar21;
                  auVar33._12_4_ = (int)(uVar21 >> 0x20);
                  auVar34 = auVar30 ^ auVar29;
                  auVar33 = (auVar33 | auVar5) ^ auVar29;
                  bVar24 = auVar34._0_4_ < auVar33._0_4_;
                  iVar35 = auVar34._4_4_;
                  iVar36 = auVar33._4_4_;
                  if ((bool)(~(iVar35 < iVar36 || iVar36 == iVar35 && bVar24) & 1)) {
                    *(double *)(lVar19 + -8 + uVar21 * 8) =
                         (double)(iVar6 + 1) * dVar32 * dVar31 + 10.0;
                  }
                  if (iVar35 >= iVar36 && (iVar36 != iVar35 || !bVar24)) {
                    *(double *)(lVar19 + uVar21 * 8) = (double)(iVar6 + 2) * dVar32 * dVar31 + 10.0;
                  }
                  uVar21 = uVar21 + 2;
                } while ((iVar3 + 1U & 0xfffffffe) != uVar21);
              }
              lVar20 = lVar20 + 1;
              lVar19 = lVar19 + (long)iVar3 * 8;
            } while (lVar20 != 6);
            lVar17 = lVar17 + 1;
            lVar23 = lVar23 + (long)iVar4 * 8;
          } while (lVar17 != 6);
          printf("\n\nPreconditioner type is           jpre = %s\n",local_90);
          bVar24 = iVar22 != 1;
          pcVar18 = "SUN_CLASSICAL_GS";
          if (!bVar24) {
            pcVar18 = "SUN_MODIFIED_GS";
          }
          printf("\nGram-Schmidt method type is    gstype = %s\n\n\n",pcVar18);
          local_c4 = iVar22;
          if (bVar24 || iVar9 != 1) {
            uVar8 = ARKStepReInit(0,pvVar14,0,f,c);
            lVar23 = local_100;
            if ((int)uVar8 < 0) {
              pcVar18 = "ARKStepReInit";
              goto LAB_001035cc;
            }
            uVar8 = SUNLinSol_SPGMRSetPrecType(local_100,iVar9);
            if ((int)uVar8 < 0) {
              pcVar18 = "SUNLinSol_SPGMRSetPrecType";
              goto LAB_001035cc;
            }
            uVar8 = SUNLinSol_SPGMRSetGSType(lVar23,iVar22);
            pvVar14 = local_f8;
            if ((int)uVar8 < 0) {
LAB_0010346d:
              pcVar18 = "SUNLinSol_SPGMRSetGSType";
              goto LAB_001035cc;
            }
          }
          else {
            pvVar14 = (void *)ARKStepCreate(0,0,f,c,local_110);
            local_f8 = pvVar14;
            if (pvVar14 == (void *)0x0) {
              main_cold_2();
              return 1;
            }
            wdata->arkode_mem = pvVar14;
            uVar8 = ARKodeSetUserData(pvVar14,wdata);
            if ((int)uVar8 < 0) {
              pcVar18 = "ARKodeSetUserData";
              goto LAB_001035cc;
            }
            uVar8 = ARKodeSStolerances(0x88e368f1,0x3ee4f8b588e368f1,pvVar14);
            if ((int)uVar8 < 0) {
              pcVar18 = "ARKodeSStolerances";
              goto LAB_001035cc;
            }
            uVar8 = ARKodeSetMaxNumSteps(pvVar14,1000);
            if ((int)uVar8 < 0) {
              pcVar18 = "ARKodeSetMaxNumSteps";
              goto LAB_001035cc;
            }
            uVar8 = ARKodeSetNonlinConvCoef(0xd2f1a9fc,pvVar14);
            if ((int)uVar8 < 0) {
              pcVar18 = "ARKodeSetNonlinConvCoef";
              goto LAB_001035cc;
            }
            lVar23 = SUNLinSol_SPGMR(c,1,0,local_110);
            if (lVar23 == 0) {
              main_cold_1();
              return 1;
            }
            uVar8 = ARKodeSetLinearSolver(pvVar14,lVar23,0);
            if ((int)uVar8 < 0) {
              pcVar18 = "ARKodeSetLinearSolver";
              goto LAB_001035cc;
            }
            uVar8 = SUNLinSol_SPGMRSetGSType(lVar23,1);
            if ((int)uVar8 < 0) goto LAB_0010346d;
            uVar8 = ARKodeSetEpsLin(0,pvVar14);
            if ((int)uVar8 < 0) {
              pcVar18 = "ARKodeSetEpsLin";
              goto LAB_001035cc;
            }
            uVar8 = ARKodeSetPreconditioner(pvVar14,Precond,PSolve);
            if ((int)uVar8 < 0) {
              pcVar18 = "ARKodeSetPreconditioner";
              goto LAB_001035cc;
            }
            uVar8 = ARKodeSetLSNormFactor((int)local_108,pvVar14);
            if ((int)uVar8 < 0) {
              pcVar18 = "ARKodeSetLSNormFactor";
              goto LAB_001035cc;
            }
            local_100 = lVar23;
            PrintAllSpecies(c,6,0x24,0.0);
          }
          iVar22 = 0;
          uVar8 = 1;
          uVar25 = 0xe2308c3a;
          uVar26 = 0x3e45798e;
          uVar27 = 0;
          uVar28 = 0;
          do {
            local_48 = uVar25;
            uStack_44 = uVar26;
            uStack_40 = uVar27;
            uStack_3c = uVar28;
            uVar10 = ARKodeEvolve(pvVar14,c,&local_c0,1);
            local_88 = local_c0;
            uVar11 = ARKodeGetNumSteps(pvVar14,&local_d0);
            if ((int)uVar11 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeGetNumSteps"
                      ,(ulong)uVar11);
            }
            uVar11 = ARKStepGetNumRhsEvals(pvVar14,&local_d8,&local_e0);
            if ((int)uVar11 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKStepGetNumRhsEvals",(ulong)uVar11);
            }
            uVar11 = ARKodeGetNumNonlinSolvIters(pvVar14,&local_e8);
            if ((int)uVar11 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumNonlinSolvIters",(ulong)uVar11);
            }
            uVar11 = ARKodeGetLastStep(pvVar14,&local_f0);
            if ((int)uVar11 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeGetLastStep"
                      ,(ulong)uVar11);
            }
            printf("t = %10.2e  nst = %ld  nfe = %ld  nfi = %ld  nni = %ld",SUB84(local_88,0),
                   local_d0,local_d8,local_e0);
            printf("  hu = %11.2e\n\n",(int)local_f0);
            if ((!bVar24 && iVar9 == 1) && (char)((char)(uVar8 / 3) * -3 + '\x01') == (char)iVar22)
            {
              PrintAllSpecies(c,6,0x24,local_c0);
            }
            if ((int)uVar10 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeEvolve",
                      (ulong)uVar10);
              break;
            }
            dVar1 = (double)CONCAT44(uStack_44,local_48);
            auVar29._12_4_ = uStack_3c;
            auVar29._8_4_ = uStack_40;
            auVar29._0_8_ = ~-(ulong)(0.9 < dVar1) & (ulong)(dVar1 * 10.0);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = (ulong)(dVar1 + 1.0) & -(ulong)(0.9 < dVar1);
            auVar29 = auVar29 | auVar5;
            iVar22 = iVar22 + -1;
            uVar8 = (uint)(byte)((char)uVar8 + 1);
            uVar25 = auVar29._0_4_;
            uVar26 = auVar29._4_4_;
            uVar27 = auVar29._8_4_;
            uVar28 = auVar29._12_4_;
          } while (iVar22 != -0x12);
          uVar8 = ARKodeGetWorkSpace(pvVar14,&local_d0,&local_d8);
          if ((int)uVar8 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeGetWorkSpace",
                    (ulong)uVar8);
          }
          uVar8 = ARKodeGetNumSteps(pvVar14,&local_f0);
          wdata = local_98;
          iVar22 = local_c4;
          iVar9 = local_c8;
          if ((int)uVar8 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeGetNumSteps",
                    (ulong)uVar8);
          }
          uVar8 = ARKStepGetNumRhsEvals(pvVar14,&local_a0,&local_50);
          if ((int)uVar8 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                    "ARKStepGetNumRhsEvals",(ulong)uVar8);
          }
          uVar8 = ARKodeGetNumLinSolvSetups(pvVar14,&local_58);
          if ((int)uVar8 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                    "ARKodeGetNumLinSolvSetups",(ulong)uVar8);
          }
          uVar8 = ARKodeGetNumErrTestFails(pvVar14,&local_68);
          if ((int)uVar8 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                    "ARKodeGetNumErrTestFails",(ulong)uVar8);
          }
          uVar8 = ARKodeGetNumNonlinSolvIters(pvVar14,&local_a8);
          if ((int)uVar8 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                    "ARKodeGetNumNonlinSolvIters",(ulong)uVar8);
          }
          uVar8 = ARKodeGetNumNonlinSolvConvFails(pvVar14,&local_60);
          if ((int)uVar8 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                    "ARKodeGetNumNonlinSolvConvFails",(ulong)uVar8);
          }
          uVar8 = ARKodeGetLinWorkSpace(pvVar14,&local_e0,&local_e8);
          if ((int)uVar8 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                    "ARKodeGetLinWorkSpace",(ulong)uVar8);
          }
          uVar8 = ARKodeGetNumLinIters(pvVar14,&local_b0);
          if ((int)uVar8 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                    "ARKodeGetNumLinIters",(ulong)uVar8);
          }
          uVar8 = ARKodeGetNumPrecEvals(pvVar14,&local_70);
          if ((int)uVar8 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                    "ARKodeGetNumPrecEvals",(ulong)uVar8);
          }
          uVar8 = ARKodeGetNumPrecSolves(pvVar14,&local_78);
          if ((int)uVar8 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                    "ARKodeGetNumPrecSolves",(ulong)uVar8);
          }
          uVar8 = ARKodeGetNumLinConvFails(pvVar14,&local_80);
          if ((int)uVar8 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                    "ARKodeGetNumLinConvFails",(ulong)uVar8);
          }
          uVar8 = ARKodeGetNumLinRhsEvals(pvVar14,&local_b8);
          if ((int)uVar8 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                    "ARKodeGetNumLinRhsEvals",(ulong)uVar8);
          }
          puts("\n\n Final statistics for this run:\n");
          printf(" ARKStep real workspace length         = %4ld \n",local_d0);
          printf(" ARKStep integer workspace length      = %4ld \n",local_d8);
          printf(" ARKLS real workspace length           = %4ld \n",local_e0);
          printf(" ARKLS integer workspace length        = %4ld \n",local_e8);
          printf(" Number of steps                       = %4ld \n",local_f0);
          printf(" Number of f-s (explicit)              = %4ld \n",local_a0);
          printf(" Number of f-s (implicit)              = %4ld \n",local_50);
          printf(" Number of f-s (SPGMR)                 = %4ld \n",local_b8);
          printf(" Number of f-s (TOTAL)                 = %4ld \n",local_b8 + local_a0);
          printf(" Number of setups                      = %4ld \n",local_58);
          printf(" Number of nonlinear iterations        = %4ld \n",local_a8);
          printf(" Number of linear iterations           = %4ld \n",local_b0);
          printf(" Number of preconditioner evaluations  = %4ld \n",local_70);
          printf(" Number of preconditioner solves       = %4ld \n",local_78);
          printf(" Number of error test failures         = %4ld \n",local_68);
          printf(" Number of nonlinear conv. failures    = %4ld \n",local_60);
          printf(" Number of linear convergence failures = %4ld \n",local_80);
          if (local_a8 < 1) {
            uVar25 = 0;
          }
          else {
            uVar25 = SUB84((double)local_b0 / (double)local_a8,0);
          }
          printf(" Average Krylov subspace dimension     = %.3f \n",uVar25);
          printf("\n\n--------------------------------------------------------------");
          puts("--------------");
          printf("--------------------------------------------------------------");
          puts("--------------");
          iVar22 = iVar22 + 1;
        } while (iVar22 != 3);
        iVar9 = iVar9 + 1;
        if (iVar9 == 3) {
          ARKodeFree(&local_f8);
          N_VDestroy(c);
          SUNLinSolFree(local_100);
          FreeUserData(wdata);
          SUNContext_Free(&local_110);
          return 0;
        }
      } while( true );
    }
    main_cold_3();
  }
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  sunrealtype abstol = ATOL, reltol = RTOL, t, tout;
  N_Vector c         = NULL;
  WebData wdata      = NULL;
  SUNLinearSolver LS = NULL;
  void* arkode_mem   = NULL;
  sunbooleantype firstrun;
  int jpre, gstype, flag;
  int ns, mxns, iout;
  int nrmfactor = 0;  /* LS norm conversion factor flag */
  sunrealtype nrmfac; /* LS norm conversion factor      */

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Retrieve the command-line options */
  if (argc > 1) { nrmfactor = atoi(argv[1]); }

  /* Initializations */
  c = N_VNew_Serial(NEQ, ctx);
  if (check_flag((void*)c, "N_VNew_Serial", 0)) { return (1); }
  wdata = AllocUserData(ctx);
  if (check_flag((void*)wdata, "AllocUserData", 2)) { return (1); }
  InitUserData(wdata);
  ns   = wdata->ns;
  mxns = wdata->mxns;

  /* Print problem description */
  PrintIntro();

  /* Loop over jpre and gstype (four cases) */
  for (jpre = SUN_PREC_LEFT; jpre <= SUN_PREC_RIGHT; jpre++)
  {
    for (gstype = SUN_MODIFIED_GS; gstype <= SUN_CLASSICAL_GS; gstype++)
    {
      /* Initialize c and print heading */
      CInit(c, wdata);
      PrintHeader(jpre, gstype);

      /* Call ARKStepCreate or ARKStepReInit, then SPGMR to set up problem */

      firstrun = (jpre == SUN_PREC_LEFT) && (gstype == SUN_MODIFIED_GS);
      if (firstrun)
      {
        arkode_mem = ARKStepCreate(NULL, f, T0, c, ctx);
        if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return (1); }

        wdata->arkode_mem = arkode_mem;

        flag = ARKodeSetUserData(arkode_mem, wdata);
        if (check_flag(&flag, "ARKodeSetUserData", 1)) { return (1); }

        flag = ARKodeSStolerances(arkode_mem, reltol, abstol);
        if (check_flag(&flag, "ARKodeSStolerances", 1)) { return (1); }

        flag = ARKodeSetMaxNumSteps(arkode_mem, 1000);
        if (check_flag(&flag, "ARKodeSetMaxNumSteps", 1)) { return (1); }

        flag = ARKodeSetNonlinConvCoef(arkode_mem, 1.e-3);
        if (check_flag(&flag, "ARKodeSetNonlinConvCoef", 1)) { return (1); }

        LS = SUNLinSol_SPGMR(c, jpre, MAXL, ctx);
        if (check_flag((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

        flag = ARKodeSetLinearSolver(arkode_mem, LS, NULL);
        if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }

        flag = SUNLinSol_SPGMRSetGSType(LS, gstype);
        if (check_flag(&flag, "SUNLinSol_SPGMRSetGSType", 1)) { return (1); }

        flag = ARKodeSetEpsLin(arkode_mem, DELT);
        if (check_flag(&flag, "ARKodeSetEpsLin", 1)) { return (1); }

        flag = ARKodeSetPreconditioner(arkode_mem, Precond, PSolve);
        if (check_flag(&flag, "ARKodeSetPreconditioner", 1)) { return (1); }

        /* Set the linear solver tolerance conversion factor */
        switch (nrmfactor)
        {
        case (1):
          /* use the square root of the vector length */
          nrmfac = SQRT((sunrealtype)NEQ);
          break;
        case (2):
          /* compute with dot product */
          nrmfac = -ONE;
          break;
        default:
          /* use the default */
          nrmfac = ZERO;
          break;
        }

        flag = ARKodeSetLSNormFactor(arkode_mem, nrmfac);
        if (check_flag(&flag, "ARKodeSetLSNormFactor", 1)) { return (1); }
      }
      else
      {
        flag = ARKStepReInit(arkode_mem, NULL, f, T0, c);
        if (check_flag(&flag, "ARKStepReInit", 1)) { return (1); }

        flag = SUNLinSol_SPGMRSetPrecType(LS, jpre);
        if (check_flag(&flag, "SUNLinSol_SPGMRSetPrecType", 1)) { return (1); }

        flag = SUNLinSol_SPGMRSetGSType(LS, gstype);
        if (check_flag(&flag, "SUNLinSol_SPGMRSetGSType", 1)) { return (1); }
      }

      /* Print initial values */
      if (firstrun) { PrintAllSpecies(c, ns, mxns, T0); }

      /* Loop over output points, call ARKodeEvolve, print sample solution values. */
      tout = T1;
      for (iout = 1; iout <= NOUT; iout++)
      {
        flag = ARKodeEvolve(arkode_mem, tout, c, &t, ARK_NORMAL);
        PrintOutput(arkode_mem, t);
        if (firstrun && (iout % 3 == 0)) { PrintAllSpecies(c, ns, mxns, t); }
        if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
        if (tout > SUN_RCONST(0.9)) { tout += DTOUT; }
        else { tout *= TOUT_MULT; }
      }

      /* Print final statistics, and loop for next case */
      PrintFinalStats(arkode_mem);
    }
  }

  /* Free all memory */
  ARKodeFree(&arkode_mem);
  N_VDestroy(c);
  SUNLinSolFree(LS);
  FreeUserData(wdata);
  SUNContext_Free(&ctx);

  return (0);
}